

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlAutoClose(htmlParserCtxtPtr ctxt,xmlChar *newtag)

{
  int iVar1;
  bool bVar2;
  xmlChar *newtag_local;
  htmlParserCtxtPtr ctxt_local;
  
  while( true ) {
    bVar2 = false;
    if ((newtag != (xmlChar *)0x0) && (bVar2 = false, ctxt->name != (xmlChar *)0x0)) {
      iVar1 = htmlCheckAutoClose(newtag,ctxt->name);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0)) {
      (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
    }
    htmlnamePop(ctxt);
  }
  if (newtag == (xmlChar *)0x0) {
    htmlAutoCloseOnEnd(ctxt);
  }
  else {
    while( true ) {
      bVar2 = false;
      if ((newtag == (xmlChar *)0x0) && (bVar2 = false, ctxt->name != (xmlChar *)0x0)) {
        iVar1 = xmlStrEqual(ctxt->name,"head");
        bVar2 = true;
        if (iVar1 == 0) {
          iVar1 = xmlStrEqual(ctxt->name,"body");
          bVar2 = true;
          if (iVar1 == 0) {
            iVar1 = xmlStrEqual(ctxt->name,"html");
            bVar2 = iVar1 != 0;
          }
        }
      }
      if (!bVar2) break;
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->sax->endElement != (endElementSAXFunc)0x0))
      {
        (*ctxt->sax->endElement)(ctxt->userData,ctxt->name);
      }
      htmlnamePop(ctxt);
    }
  }
  return;
}

Assistant:

static void
htmlAutoClose(htmlParserCtxtPtr ctxt, const xmlChar * newtag)
{
    while ((newtag != NULL) && (ctxt->name != NULL) &&
           (htmlCheckAutoClose(newtag, ctxt->name))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
    if (newtag == NULL) {
        htmlAutoCloseOnEnd(ctxt);
        return;
    }
    while ((newtag == NULL) && (ctxt->name != NULL) &&
           ((xmlStrEqual(ctxt->name, BAD_CAST "head")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "body")) ||
            (xmlStrEqual(ctxt->name, BAD_CAST "html")))) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}